

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O1

void duckdb::BinaryTrimFunction<true,true>(DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  value_type vVar2;
  value_type vVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  long lVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar10;
  Vector *this_00;
  TemplatedValidityData<unsigned_long> *pTVar11;
  ulong uVar12;
  UnifiedVectorFormat *pUVar13;
  UnifiedVectorFormat *pUVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  VectorType VVar19;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  ulong uVar20;
  undefined8 *puVar21;
  UnifiedVectorFormat *pUVar22;
  anon_struct_16_3_d7536bce_for_pointer aVar23;
  string_t sVar24;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  anon_class_8_1_6971b95b aVar25;
  anon_class_8_1_6971b95b aVar26;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,1);
  vVar2 = *vector;
  vVar3 = *vector_00;
  VVar19 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar19);
    paVar4 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      aVar23 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector_00 + 0x20))->pointer,
                          in_R9,in_stack_fffffffffffffee8);
      paVar4->pointer = aVar23;
      return;
    }
  }
  else {
    pUVar22 = *(UnifiedVectorFormat **)(input + 0x18);
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar5 = *(long *)(vector + 0x20);
      paVar4 = *(anon_union_16_2_67f50693_for_value **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        aVar26.result = result;
        duckdb::Vector::SetVectorType(VVar19);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar22 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar23 = paVar4->pointer;
          lVar15 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar15);
            left_02.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar15);
            sVar24 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,(string_t)aVar23,in_R9,
                                (idx_t)aVar26.result);
            *(long *)(lVar6 + -8 + lVar15) = sVar24.value._0_8_;
            *(long *)(lVar6 + lVar15) = sVar24.value._8_8_;
            lVar15 = lVar15 + 0x10;
            pUVar22 = pUVar22 + -1;
          } while (pUVar22 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar22 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        uVar12 = 0;
        pUVar13 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar17 = 0xffffffffffffffff;
          }
          else {
            uVar17 = *(ulong *)(*(long *)(result + 0x28) + uVar12 * 8);
          }
          pUVar10 = pUVar13 + 0x40;
          if (pUVar22 <= pUVar13 + 0x40) {
            pUVar10 = pUVar22;
          }
          pUVar14 = pUVar10;
          aVar25.result = aVar26.result;
          if (uVar17 != 0) {
            pUVar14 = pUVar13;
            result = aVar26.result;
            if (uVar17 == 0xffffffffffffffff) {
              if (pUVar13 < pUVar10) {
                aVar23 = paVar4->pointer;
                uVar17 = (long)pUVar13 << 4 | 8;
                do {
                  left.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar17);
                  left.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar17);
                  sVar24 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (aVar26,left,(string_t)aVar23,in_R9,(idx_t)aVar25.result);
                  *(long *)(lVar6 + -8 + uVar17) = sVar24.value._0_8_;
                  *(long *)(lVar6 + uVar17) = sVar24.value._8_8_;
                  pUVar13 = pUVar13 + 1;
                  uVar17 = uVar17 + 0x10;
                  pUVar14 = pUVar13;
                } while (pUVar10 != pUVar13);
              }
            }
            else if (pUVar13 < pUVar10) {
              uVar20 = (long)pUVar13 << 4 | 8;
              uVar18 = 0;
              do {
                if ((uVar17 >> (uVar18 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar20);
                  left_00.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar20);
                  sVar24 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,
                                      (string_t)paVar4->pointer,in_R9,(idx_t)result);
                  *(long *)(lVar6 + -8 + uVar20) = sVar24.value._0_8_;
                  *(long *)(lVar6 + uVar20) = sVar24.value._8_8_;
                }
                uVar18 = uVar18 + 1;
                uVar20 = uVar20 + 0x10;
              } while (pUVar13 + (uVar18 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
              pUVar14 = pUVar13 + uVar18;
              aVar25.result = result;
            }
          }
          uVar12 = uVar12 + 1;
          pUVar13 = pUVar14;
          aVar26.result = aVar25.result;
        } while (uVar12 != (ulong)(pUVar22 + 0x3f) >> 6);
        return;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          lVar5 = *(long *)(vector + 0x20);
          lVar6 = *(long *)(vector_00 + 0x20);
          aVar26.result = result;
          duckdb::Vector::SetVectorType(VVar19);
          lVar15 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (pUVar22 != (UnifiedVectorFormat *)0x0) {
              lVar16 = 8;
              do {
                sVar24.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar16);
                sVar24.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar16);
                right_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + lVar16);
                right_06.value._0_8_ = *(undefined8 *)(lVar6 + -8 + lVar16);
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar24,right_06,in_R9,
                                    (idx_t)aVar26.result);
                *(long *)(lVar15 + -8 + lVar16) = sVar24.value._0_8_;
                *(long *)(lVar15 + lVar16) = sVar24.value._8_8_;
                lVar16 = lVar16 + 0x10;
                pUVar22 = pUVar22 + -1;
              } while (pUVar22 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar22 + 0x3f) {
            uVar12 = 0;
            pUVar13 = (UnifiedVectorFormat *)0x0;
            do {
              lVar16 = *(long *)(result + 0x28);
              if (lVar16 == 0) {
                uVar17 = 0xffffffffffffffff;
              }
              else {
                uVar17 = *(ulong *)(lVar16 + uVar12 * 8);
              }
              pUVar10 = pUVar13 + 0x40;
              if (pUVar22 <= pUVar13 + 0x40) {
                pUVar10 = pUVar22;
              }
              pUVar14 = pUVar10;
              if (uVar17 != 0) {
                pUVar14 = pUVar13;
                if (uVar17 == 0xffffffffffffffff) {
                  if (pUVar13 < pUVar10) {
                    uVar17 = (long)pUVar13 << 4 | 8;
                    do {
                      left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar17);
                      left_03.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar17);
                      right_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + uVar17);
                      right_02.value._0_8_ = *(undefined8 *)(lVar6 + -8 + uVar17);
                      sVar24 = BinaryLambdaWrapper::
                               Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         (aVar26,left_03,right_02,in_R9,(idx_t)aVar26.result);
                      *(long *)(lVar15 + -8 + uVar17) = sVar24.value._0_8_;
                      *(long *)(lVar15 + uVar17) = sVar24.value._8_8_;
                      pUVar14 = pUVar14 + 1;
                      uVar17 = uVar17 + 0x10;
                    } while (pUVar10 != pUVar14);
                  }
                }
                else if (pUVar13 < pUVar10) {
                  uVar18 = (long)pUVar13 << 4 | 8;
                  uVar20 = 0;
                  do {
                    if ((uVar17 >> (uVar20 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar18);
                      left_04.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar18);
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + uVar18);
                      right_03.value._0_8_ = *(undefined8 *)(lVar6 + -8 + uVar18);
                      sVar24 = BinaryLambdaWrapper::
                               Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         (aVar26,left_04,right_03,in_R9,(idx_t)aVar26.result);
                      *(long *)(lVar15 + -8 + uVar18) = sVar24.value._0_8_;
                      *(long *)(lVar15 + uVar18) = sVar24.value._8_8_;
                    }
                    uVar20 = uVar20 + 1;
                    uVar18 = uVar18 + 0x10;
                  } while (pUVar13 + (uVar20 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
                  pUVar14 = pUVar13 + uVar20;
                }
              }
              uVar12 = uVar12 + 1;
              pUVar13 = pUVar14;
            } while (uVar12 != (ulong)(pUVar22 + 0x3f) >> 6);
          }
        }
        else {
          aVar26.result = result;
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar22);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar22);
          duckdb::Vector::SetVectorType(VVar19);
          lVar5 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            if (pUVar22 != (UnifiedVectorFormat *)0x0) {
              lVar6 = *local_78;
              lVar15 = *local_c0;
              puVar21 = (undefined8 *)(lVar5 + 8);
              pUVar13 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar10 = pUVar13;
                if (lVar6 != 0) {
                  pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar13 * 4);
                }
                pUVar14 = pUVar13;
                if (lVar15 != 0) {
                  pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar15 + (long)pUVar13 * 4);
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar10 * 0x10);
                left_01.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar10 * 0x10);
                right.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar14 * 0x10);
                right.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar14 * 0x10);
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   (aVar26,left_01,right,in_R9,(idx_t)aVar26.result);
                puVar21[-1] = sVar24.value._0_8_;
                *puVar21 = sVar24.value._8_8_;
                pUVar13 = pUVar13 + 1;
                puVar21 = puVar21 + 2;
              } while (pUVar22 != pUVar13);
            }
          }
          else if (pUVar22 != (UnifiedVectorFormat *)0x0) {
            lVar6 = *local_78;
            lVar15 = *local_c0;
            this_00 = aVar26.result + 0x30;
            puVar21 = (undefined8 *)(lVar5 + 8);
            pUVar13 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar10 = pUVar13;
              if (lVar6 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar13 * 4);
              }
              pUVar14 = pUVar13;
              if (lVar15 != 0) {
                pUVar14 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar15 + (long)pUVar13 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar14 >> 6) * 8) >> ((ulong)pUVar14 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar10 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar10 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar14 * 0x10);
                right_04.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar14 * 0x10);
                sVar24 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   (aVar26,left_05,right_04,in_R9,(idx_t)aVar26.result);
                puVar21[-1] = sVar24.value._0_8_;
                *puVar21 = sVar24.value._8_8_;
              }
              else {
                if (*(long *)(aVar26.result + 0x28) == 0) {
                  local_c8 = *(unsigned_long *)(aVar26.result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var9 = p_Stack_d0;
                  uVar8 = local_d8;
                  local_d8 = 0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(aVar26.result + 0x38);
                  *(undefined8 *)(aVar26.result + 0x30) = uVar8;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(aVar26.result + 0x38) = p_Var9;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)this_00);
                  *(unsigned_long **)(aVar26.result + 0x28) =
                       (pTVar11->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar7 = (byte)pUVar13 & 0x3f;
                puVar1 = (ulong *)(*(long *)(aVar26.result + 0x28) + ((ulong)pUVar13 >> 6) * 8);
                *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              pUVar13 = pUVar13 + 1;
              puVar21 = puVar21 + 2;
            } while (pUVar22 != pUVar13);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        return;
      }
      paVar4 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      lVar5 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        aVar26.result = result;
        duckdb::Vector::SetVectorType(VVar19);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar22 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar23 = paVar4->pointer;
          lVar15 = 8;
          do {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar15);
            right_05.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar15);
            sVar24 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar23,right_05,in_R9,
                                (idx_t)aVar26.result);
            *(long *)(lVar6 + -8 + lVar15) = sVar24.value._0_8_;
            *(long *)(lVar6 + lVar15) = sVar24.value._8_8_;
            lVar15 = lVar15 + 0x10;
            pUVar22 = pUVar22 + -1;
          } while (pUVar22 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar22 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        uVar12 = 0;
        pUVar13 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar17 = 0xffffffffffffffff;
          }
          else {
            uVar17 = *(ulong *)(*(long *)(result + 0x28) + uVar12 * 8);
          }
          pUVar10 = pUVar13 + 0x40;
          if (pUVar22 <= pUVar13 + 0x40) {
            pUVar10 = pUVar22;
          }
          pUVar14 = pUVar10;
          result = aVar26.result;
          aVar25.result = aVar26.result;
          if (uVar17 != 0) {
            pUVar14 = pUVar13;
            if (uVar17 == 0xffffffffffffffff) {
              if (pUVar13 < pUVar10) {
                aVar23 = paVar4->pointer;
                uVar17 = (long)pUVar13 << 4 | 8;
                do {
                  right_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar17);
                  right_00.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar17);
                  sVar24 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (aVar26,(string_t)aVar23,right_00,in_R9,(idx_t)aVar25.result);
                  *(long *)(lVar6 + -8 + uVar17) = sVar24.value._0_8_;
                  *(long *)(lVar6 + uVar17) = sVar24.value._8_8_;
                  pUVar13 = pUVar13 + 1;
                  uVar17 = uVar17 + 0x10;
                  pUVar14 = pUVar13;
                } while (pUVar10 != pUVar13);
              }
            }
            else if (pUVar13 < pUVar10) {
              uVar18 = (long)pUVar13 << 4 | 8;
              uVar20 = 0;
              do {
                if ((uVar17 >> (uVar20 & 0x3f) & 1) != 0) {
                  right_01.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar18);
                  right_01.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar18);
                  sVar24 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<true,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (aVar26,(string_t)paVar4->pointer,right_01,in_R9,
                                      (idx_t)aVar26.result);
                  *(long *)(lVar6 + -8 + uVar18) = sVar24.value._0_8_;
                  *(long *)(lVar6 + uVar18) = sVar24.value._8_8_;
                }
                uVar20 = uVar20 + 1;
                uVar18 = uVar18 + 0x10;
              } while (pUVar13 + (uVar20 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
              pUVar14 = pUVar13 + uVar20;
              result = aVar26.result;
              aVar25.result = aVar26.result;
            }
          }
          uVar12 = uVar12 + 1;
          pUVar13 = pUVar14;
          aVar26.result = aVar25.result;
        } while (uVar12 != (ulong)(pUVar22 + 0x3f) >> 6);
        return;
      }
    }
    duckdb::Vector::SetVectorType(VVar19);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BinaryTrimFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t input, string_t ignored) {
		    auto data = input.GetData();
		    auto size = input.GetSize();

		    unordered_set<utf8proc_int32_t> ignored_codepoints;
		    GetIgnoredCodepoints(ignored, ignored_codepoints);

		    utf8proc_int32_t codepoint;
		    auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		    // Find the first character that is not left trimmed
		    idx_t begin = 0;
		    if (LTRIM) {
			    while (begin < size) {
				    auto bytes =
				        utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    break;
				    }
				    begin += UnsafeNumericCast<idx_t>(bytes);
			    }
		    }

		    // Find the last character that is not right trimmed
		    idx_t end;
		    if (RTRIM) {
			    end = begin;
			    for (auto next = begin; next < size;) {
				    auto bytes =
				        utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				    D_ASSERT(bytes > 0);
				    next += UnsafeNumericCast<idx_t>(bytes);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    end = next;
				    }
			    }
		    } else {
			    end = size;
		    }

		    // Copy the trimmed string
		    auto target = StringVector::EmptyString(result, end - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, end - begin);

		    target.Finalize();
		    return target;
	    });
}